

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void TestLogging(bool check_counts)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  __atomic_base<int> _Var4;
  ostream *poVar5;
  size_t sVar6;
  LogMessageData *pLVar7;
  uint uVar8;
  undefined7 in_register_00000039;
  SendMethod in_R9;
  LogMessage outer;
  char s [6];
  char const_s [12];
  char local_135;
  uint local_134;
  LogMessage local_130;
  undefined4 local_cc;
  char local_c8 [8];
  undefined1 local_c0 [96];
  uint *local_60;
  char local_58 [16];
  int64 local_48;
  int64 local_40;
  int64 local_38;
  
  local_cc = (undefined4)CONCAT71(in_register_00000039,check_counts);
  local_38 = google::LogMessage::num_messages(0);
  local_40 = google::LogMessage::num_messages(1);
  local_48 = google::LogMessage::num_messages(2);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x131);
  poVar5 = google::LogMessage::stream(&local_130);
  local_c0._0_8_ = (LogMessageData *)(local_c0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"foo ","");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_c0._0_8_,local_c0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"bar ",4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,10);
  local_58[0] = 0x20;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_58,1);
  std::ostream::_M_insert<double>(3.4);
  if ((LogMessageData *)local_c0._0_8_ != (LogMessageData *)(local_c0 + 0x10)) {
    free((void *)local_c0._0_8_);
  }
  google::LogMessage::~LogMessage(&local_130);
  local_60 = (uint *)__errno_location();
  uVar8 = 0;
  do {
    uVar1 = *local_60;
    *local_60 = uVar8;
    LOCK();
    TestLogging::occurrences_309.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_309.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + 1)._M_i;
    if (2 < (int)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i + -1);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    local_134 = uVar8;
    if (TestLogging::occurrences_mod_n_309.super___atomic_base<int>._M_i == 1) {
      local_c0._0_8_ = google::LogMessage::SendToLog;
      local_c0._8_8_ = (LogMessageData *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x135,ERROR,(long)(int)TestLogging::occurrences_309.super___atomic_base<int>._M_i,
                 in_R9);
      poVar5 = google::LogMessage::stream(&local_130);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Plog every 2, iteration ",0x18);
      google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_130);
    }
    *local_60 = uVar1;
    LOCK();
    TestLogging::occurrences_312.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_312.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + 1)._M_i;
    if (3 < (int)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i + -2);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    if (TestLogging::occurrences_mod_n_312.super___atomic_base<int>._M_i == 1) {
      local_c0._0_8_ = google::LogMessage::SendToLog;
      local_c0._8_8_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x138,ERROR,(long)(int)TestLogging::occurrences_312.super___atomic_base<int>._M_i,
                 in_R9);
      poVar5 = google::LogMessage::stream(&local_130);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Log every 3, iteration ",0x17);
      poVar5 = google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      google::LogMessage::~LogMessage(&local_130);
    }
    LOCK();
    TestLogging::occurrences_313.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_313.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    UNLOCK();
    _Var4._M_i = (TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + 1)._M_i;
    if (4 < (int)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + 1) {
      LOCK();
      TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           ((int)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i + -3);
      UNLOCK();
      _Var4._M_i = (__int_type)TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i;
    }
    TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i =
         (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
    if (TestLogging::occurrences_mod_n_313.super___atomic_base<int>._M_i == 1) {
      local_c0._0_8_ = google::LogMessage::SendToLog;
      local_c0._8_8_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x139,ERROR,(long)(int)TestLogging::occurrences_313.super___atomic_base<int>._M_i,
                 in_R9);
      poVar5 = google::LogMessage::stream(&local_130);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Log every 4, iteration ",0x17);
      poVar5 = google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      google::LogMessage::~LogMessage(&local_130);
    }
    LOCK();
    TestLogging::occurrences_315.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_315.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i =
         (__atomic_base<int>)
         ((int)TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i +
          (((int)TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i + 1) / 5) * -5 + 1
         );
    LOCK();
    UNLOCK();
    if (TestLogging::occurrences_mod_n_315.super___atomic_base<int>._M_i == 1) {
      local_c0._0_8_ = google::LogMessage::SendToLog;
      local_c0._8_8_ = (LogMessageData *)0x0;
      google::LogMessage::LogMessage
                (&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x13b,GLOG_WARNING,
                 (long)(int)TestLogging::occurrences_315.super___atomic_base<int>._M_i,in_R9);
      poVar5 = google::LogMessage::stream(&local_130);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Log if every 5, iteration ",0x1a);
      google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
      google::LogMessage::~LogMessage(&local_130);
    }
    LOCK();
    TestLogging::occurrences_316.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_316.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    LOCK();
    TestLogging::occurrences_318.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_318.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    local_c0._0_8_ = google::LogMessage::SendToLog;
    local_c0._8_8_ = (LogMessageData *)0x0;
    google::LogMessage::LogMessage
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x13e,GLOG_INFO,
               (long)(int)TestLogging::occurrences_318.super___atomic_base<int>._M_i,in_R9);
    poVar5 = google::LogMessage::stream(&local_130);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Log if every 1, iteration ",0x1a);
    google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
    google::LogMessage::~LogMessage(&local_130);
    LOCK();
    TestLogging::occurrences_319.super___atomic_base<int>._M_i =
         (__atomic_base<int>)((int)TestLogging::occurrences_319.super___atomic_base<int>._M_i + 1);
    UNLOCK();
    if (local_134 < 3) {
      TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i =
           (__atomic_base<int>)
           (((int)TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i -
            (((int)TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i -
             ((int)TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i + 1 >> 0x1f)) +
             1U & 0xfffffffe)) + 1);
      LOCK();
      UNLOCK();
      if (TestLogging::occurrences_mod_n_319.super___atomic_base<int>._M_i == 1) {
        local_c0._0_8_ = google::LogMessage::SendToLog;
        local_c0._8_8_ = (LogMessageData *)0x0;
        google::LogMessage::LogMessage
                  (&local_130,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x13f,ERROR,
                   (long)(int)TestLogging::occurrences_319.super___atomic_base<int>._M_i,in_R9);
        poVar5 = google::LogMessage::stream(&local_130);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Log if less than 3 every 2, iteration ",0x26);
        google::operator<<(poVar5,(Counter_t *)&google::COUNTER);
        google::LogMessage::~LogMessage(&local_130);
      }
    }
    uVar8 = local_134 + 1;
  } while (uVar8 != 10);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x142,GLOG_WARNING);
  poVar5 = google::LogMessage::stream(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"log_if this",0xb);
  google::LogMessage::~LogMessage(&local_130);
  builtin_strncpy(local_c8,"array",6);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x146);
  poVar5 = google::LogMessage::stream(&local_130);
  sVar6 = strlen(local_c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c8,sVar6);
  google::LogMessage::~LogMessage(&local_130);
  builtin_strncpy(local_58,"const array",0xc);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x148);
  poVar5 = google::LogMessage::stream(&local_130);
  sVar6 = strlen(local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_58,sVar6);
  google::LogMessage::~LogMessage(&local_130);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14a,ERROR);
  poVar5 = google::LogMessage::stream(&local_130);
  local_c0._0_8_ = (LogMessageData *)(local_c0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"foo","");
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_c0._0_8_,local_c0._8_8_);
  local_135 = ' ';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_135,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,1000);
  local_135 = ' ';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_135,1);
  *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 10;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  pp_Var2 = poVar5->_vptr_basic_ostream;
  *(undefined8 *)(&poVar5->field_0x10 + (long)pp_Var2[-3]) = 1;
  p_Var3 = pp_Var2[-3];
  *(uint *)(&poVar5->field_0x18 + (long)p_Var3) =
       *(uint *)(&poVar5->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
  std::ostream::operator<<(poVar5,1000);
  if ((LogMessageData *)local_c0._0_8_ != (LogMessageData *)(local_c0 + 0x10)) {
    free((void *)local_c0._0_8_);
  }
  google::LogMessage::~LogMessage(&local_130);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14c);
  poVar5 = google::LogMessage::stream(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"foo ",4);
  *(undefined8 *)(&poVar5->field_0x10 + (long)poVar5->_vptr_basic_ostream[-3]) = 10;
  std::ostream::_M_insert<double>(1.0);
  google::LogMessage::~LogMessage(&local_130);
  google::LogMessage::LogMessage
            (&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x14f,ERROR);
  poVar5 = google::LogMessage::stream(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"outer",5);
  google::LogMessage::LogMessage
            ((LogMessage *)local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x152,ERROR);
  poVar5 = google::LogMessage::stream((LogMessage *)local_c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"inner",5);
  google::LogMessage::~LogMessage((LogMessage *)local_c0);
  google::LogMessage::~LogMessage(&local_130);
  google::LogMessage::LogMessage(&local_130,"foo",-1,GLOG_INFO);
  poVar5 = google::LogMessage::stream(&local_130);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"no prefix",9);
  google::LogMessage::~LogMessage(&local_130);
  if ((char)local_cc == '\0') {
    return;
  }
  local_130.allocated_ = (LogMessageData *)(local_38 + 0xf);
  pLVar7 = (LogMessageData *)0x0;
  local_c0._0_8_ = google::LogMessage::num_messages(0);
  if (local_130.allocated_ != (LogMessageData *)local_c0._0_8_) {
    pLVar7 = (LogMessageData *)
             google::MakeCheckOpString<long,long>
                       ((long *)&local_130,(long *)local_c0,
                        "base_num_infos + 15 == LogMessage::num_messages(GLOG_INFO)");
  }
  if (pLVar7 == (LogMessageData *)0x0) {
    local_130.allocated_ = (LogMessageData *)(local_40 + 3);
    local_c0._0_8_ = google::LogMessage::num_messages(1);
    if (local_130.allocated_ == (LogMessageData *)local_c0._0_8_) {
      pLVar7 = (LogMessageData *)0x0;
    }
    else {
      pLVar7 = (LogMessageData *)
               google::MakeCheckOpString<long,long>
                         ((long *)&local_130,(long *)local_c0,
                          "base_num_warning + 3 == LogMessage::num_messages(GLOG_WARNING)");
    }
    if (pLVar7 == (LogMessageData *)0x0) {
      local_130.allocated_ = (LogMessageData *)(local_48 + 0x11);
      local_c0._0_8_ = google::LogMessage::num_messages(2);
      if (local_130.allocated_ == (LogMessageData *)local_c0._0_8_) {
        local_c0._0_8_ = (LogMessageData *)0x0;
      }
      else {
        local_c0._0_8_ =
             google::MakeCheckOpString<long,long>
                       ((long *)&local_130,(long *)local_c0,
                        "base_num_errors + 17 == LogMessage::num_messages(GLOG_ERROR)");
      }
      if ((LogMessageData *)local_c0._0_8_ == (LogMessageData *)0x0) {
        return;
      }
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15b,(CheckOpString *)local_c0);
      google::LogMessage::stream(&local_130);
    }
    else {
      local_c0._0_8_ = pLVar7;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x15a,(CheckOpString *)local_c0);
      google::LogMessage::stream(&local_130);
    }
  }
  else {
    local_c0._0_8_ = pLVar7;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x159,(CheckOpString *)local_c0);
    google::LogMessage::stream(&local_130);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_130);
}

Assistant:

void TestLogging(bool check_counts) {
  int64 base_num_infos = LogMessage::num_messages(GLOG_INFO);
  int64 base_num_warning = LogMessage::num_messages(GLOG_WARNING);
  int64 base_num_errors = LogMessage::num_messages(GLOG_ERROR);

  LOG(INFO) << string("foo ") << "bar " << 10 << ' ' << 3.4;
  for (int i = 0; i < 10; ++i) {
    int old_errno = errno;
    errno = i;
    PLOG_EVERY_N(ERROR, 2) << "Plog every 2, iteration " << COUNTER;
    errno = old_errno;

    LOG_EVERY_N(ERROR, 3) << "Log every 3, iteration " << COUNTER << endl;
    LOG_EVERY_N(ERROR, 4) << "Log every 4, iteration " << COUNTER << endl;

    LOG_IF_EVERY_N(WARNING, true, 5) << "Log if every 5, iteration " << COUNTER;
    LOG_IF_EVERY_N(WARNING, false, 3)
        << "Log if every 3, iteration " << COUNTER;
    LOG_IF_EVERY_N(INFO, true, 1) << "Log if every 1, iteration " << COUNTER;
    LOG_IF_EVERY_N(ERROR, (i < 3), 2)
        << "Log if less than 3 every 2, iteration " << COUNTER;
  }
  LOG_IF(WARNING, true) << "log_if this";
  LOG_IF(WARNING, false) << "don't log_if this";

  char s[] = "array";
  LOG(INFO) << s;
  const char const_s[] = "const array";
  LOG(INFO) << const_s;
  int j = 1000;
  LOG(ERROR) << string("foo") << ' ' << j << ' ' << setw(10) << j << " "
             << setw(1) << hex << j;
  LOG(INFO) << "foo " << std::setw(10) << 1.0;

  {
    google::LogMessage outer(__FILE__, __LINE__, GLOG_ERROR);
    outer.stream() << "outer";

    LOG(ERROR) << "inner";
  }

  LogMessage("foo", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << "no prefix";

  if (check_counts) {
    CHECK_EQ(base_num_infos + 15, LogMessage::num_messages(GLOG_INFO));
    CHECK_EQ(base_num_warning + 3, LogMessage::num_messages(GLOG_WARNING));
    CHECK_EQ(base_num_errors + 17, LogMessage::num_messages(GLOG_ERROR));
  }
}